

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.cpp
# Opt level: O0

void printBits(ostream *os,half h)

{
  uint16_t uVar1;
  ostream *in_RDI;
  int i;
  unsigned_short b;
  char local_19;
  int local_18;
  half local_2;
  
  uVar1 = Imath_3_1::half::bits(&local_2);
  for (local_18 = 0xf; -1 < local_18; local_18 = local_18 + -1) {
    local_19 = '1';
    if (((int)(uint)uVar1 >> ((byte)local_18 & 0x1f) & 1U) == 0) {
      local_19 = '0';
    }
    std::operator<<(in_RDI,local_19);
    if ((local_18 == 0xf) || (local_18 == 10)) {
      std::operator<<(in_RDI,' ');
    }
  }
  return;
}

Assistant:

IMATH_EXPORT void
printBits (ostream& os, half h)
{
    unsigned short b = h.bits();

    for (int i = 15; i >= 0; i--)
    {
        os << (((b >> i) & 1) ? '1' : '0');

        if (i == 15 || i == 10)
            os << ' ';
    }
}